

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v6_3.c
# Opt level: O3

int can_calc_bittiming_v6_3
              (net_device *dev,can_bittiming *bt,can_bittiming_const *btc,netlink_ext_ack *extack)

{
  uint tseg;
  __u32 _min1;
  uint uVar1;
  __u32 _Var2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint tseg2;
  uint tseg1;
  uint sample_point_error;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_60;
  uint local_5c;
  net_device *local_58;
  uint local_50;
  __u32 local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  can_bittiming_const *local_38;
  
  local_5c = 0;
  local_70 = 0;
  local_60 = 0;
  local_6c = bt->sample_point;
  if (bt->sample_point == 0) {
    local_6c = 0x2ee;
    if (bt->bitrate < 0xc3501) {
      local_6c = 0x36b;
      if (500000 < bt->bitrate) {
        local_6c = 800;
      }
    }
  }
  uVar10 = (btc->tseg2_max + btc->tseg1_max) * 2 + 1;
  uVar3 = (btc->tseg2_min + btc->tseg1_min) * 2;
  local_78 = 0xffffffff;
  local_74 = 0;
  local_58 = dev;
  if (uVar3 <= uVar10) {
    _Var2 = (dev->priv).clock.freq;
    uVar7 = bt->bitrate;
    local_40 = btc->brp_min;
    local_44 = btc->brp_inc;
    local_70 = 0;
    local_78 = 0xffffffff;
    uVar6 = 0xffffffff;
    local_74 = 0;
    local_50 = uVar7;
    local_4c = _Var2;
    local_48 = uVar3;
    local_38 = btc;
    do {
      tseg = uVar10 >> 1;
      uVar8 = (uVar10 & 1) + _Var2 / (uVar7 * (tseg + 1));
      uVar8 = uVar8 - uVar8 % local_44;
      if ((local_40 <= uVar8) && (uVar8 <= btc->brp_max)) {
        uVar5 = _Var2 / ((tseg + 1) * uVar8);
        uVar1 = uVar7 - uVar5;
        uVar9 = -uVar1;
        if (0 < (int)uVar1) {
          uVar9 = uVar1;
        }
        if (uVar9 <= local_78) {
          if (uVar9 < local_78) {
            uVar6 = 0xffffffff;
          }
          can_update_sample_point_v6_3(btc,local_6c,tseg,&local_5c,&local_60,&local_3c);
          btc = local_38;
          uVar3 = local_48;
          _Var2 = local_4c;
          uVar7 = local_50;
          if ((local_3c < uVar6) &&
             (local_74 = uVar8, uVar6 = local_3c, local_70 = tseg, local_78 = uVar9,
             uVar5 == local_50 && local_3c == 0)) goto LAB_00102b11;
        }
      }
      uVar10 = uVar10 - 1;
    } while (uVar3 <= uVar10);
    if (local_78 == 0) goto LAB_00102b11;
  }
  if (0x32 < (uint)(((ulong)local_78 * 1000) / (ulong)bt->bitrate)) {
    return -0x16;
  }
LAB_00102b11:
  _Var2 = can_update_sample_point_v6_3(btc,local_6c,local_70,&local_5c,&local_60,(uint *)0x0);
  bt->sample_point = _Var2;
  bt->tq = (__u32)(((ulong)local_74 * 1000000000) / (ulong)(local_58->priv).clock.freq);
  bt->prop_seg = local_5c >> 1;
  uVar3 = local_5c - (local_5c >> 1);
  bt->phase_seg1 = uVar3;
  bt->phase_seg2 = local_60;
  uVar10 = bt->sjw;
  if (uVar10 == 0) {
    uVar10 = local_60 >> 1;
    if (uVar3 < local_60 >> 1) {
      uVar10 = uVar3;
    }
    uVar10 = uVar10 + (uVar10 == 0);
    bt->sjw = uVar10;
  }
  iVar4 = -0x16;
  if ((uVar10 <= local_60 && uVar10 <= uVar3) && uVar10 <= btc->sjw_max) {
    bt->brp = local_74;
    iVar4 = 0;
    bt->bitrate = (local_58->priv).clock.freq / ((local_60 + local_5c + 1) * local_74);
  }
  return iVar4;
}

Assistant:

int can_calc_bittiming(const struct net_device *dev, struct can_bittiming *bt,
		       const struct can_bittiming_const *btc, struct netlink_ext_ack *extack)
{
	struct can_priv *priv = netdev_priv(dev);
	unsigned int bitrate;			/* current bitrate */
	unsigned int bitrate_error;		/* difference between current and nominal value */
	unsigned int best_bitrate_error = UINT_MAX;
	unsigned int sample_point_error;	/* difference between current and nominal value */
	unsigned int best_sample_point_error = UINT_MAX;
	unsigned int sample_point_nominal;	/* nominal sample point */
	unsigned int best_tseg = 0;		/* current best value for tseg */
	unsigned int best_brp = 0;		/* current best value for brp */
	unsigned int brp, tsegall, tseg, tseg1 = 0, tseg2 = 0;
	u64 v64;
	int err;

	/* Use CiA recommended sample points */
	if (bt->sample_point) {
		sample_point_nominal = bt->sample_point;
	} else {
		if (bt->bitrate > 800 * KILO /* BPS */)
			sample_point_nominal = 750;
		else if (bt->bitrate > 500 * KILO /* BPS */)
			sample_point_nominal = 800;
		else
			sample_point_nominal = 875;
	}

	/* tseg even = round down, odd = round up */
	for (tseg = (btc->tseg1_max + btc->tseg2_max) * 2 + 1;
	     tseg >= (btc->tseg1_min + btc->tseg2_min) * 2; tseg--) {
		tsegall = CAN_SYNC_SEG + tseg / 2;

		/* Compute all possible tseg choices (tseg=tseg1+tseg2) */
		brp = priv->clock.freq / (tsegall * bt->bitrate) + tseg % 2;

		/* choose brp step which is possible in system */
		brp = (brp / btc->brp_inc) * btc->brp_inc;
		if (brp < btc->brp_min || brp > btc->brp_max)
			continue;

		bitrate = priv->clock.freq / (brp * tsegall);
		bitrate_error = abs(bt->bitrate - bitrate);

		/* tseg brp biterror */
		if (bitrate_error > best_bitrate_error)
			continue;

		/* reset sample point error if we have a better bitrate */
		if (bitrate_error < best_bitrate_error)
			best_sample_point_error = UINT_MAX;

		can_update_sample_point(btc, sample_point_nominal, tseg / 2,
					&tseg1, &tseg2, &sample_point_error);
		if (sample_point_error >= best_sample_point_error)
			continue;

		best_sample_point_error = sample_point_error;
		best_bitrate_error = bitrate_error;
		best_tseg = tseg / 2;
		best_brp = brp;

		if (bitrate_error == 0 && sample_point_error == 0)
			break;
	}

	if (best_bitrate_error) {
		/* Error in one-tenth of a percent */
		v64 = (u64)best_bitrate_error * 1000;
		do_div(v64, bt->bitrate);
		bitrate_error = (u32)v64;
		if (bitrate_error > CAN_CALC_MAX_ERROR) {
			NL_SET_ERR_MSG_FMT(extack,
					   "bitrate error: %u.%u%% too high",
					   bitrate_error / 10, bitrate_error % 10);
			return -EINVAL;
		}
		NL_SET_ERR_MSG_FMT(extack,
				   "bitrate error: %u.%u%%",
				   bitrate_error / 10, bitrate_error % 10);
	}

	/* real sample point */
	bt->sample_point = can_update_sample_point(btc, sample_point_nominal,
						   best_tseg, &tseg1, &tseg2,
						   NULL);

	v64 = (u64)best_brp * 1000 * 1000 * 1000;
	do_div(v64, priv->clock.freq);
	bt->tq = (u32)v64;
	bt->prop_seg = tseg1 / 2;
	bt->phase_seg1 = tseg1 - bt->prop_seg;
	bt->phase_seg2 = tseg2;

	can_sjw_set_default(bt);

	err = can_sjw_check(dev, bt, btc, extack);
	if (err)
		return err;

	bt->brp = best_brp;

	/* real bitrate */
	bt->bitrate = priv->clock.freq /
		(bt->brp * can_bit_time(bt));

	return 0;
}